

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-test.c++
# Opt level: O0

Own<kj::Directory> __thiscall kj::anon_unknown_0::TempDir::get(TempDir *this)

{
  int osErrorNumber;
  void *pvVar1;
  Directory *extraout_RDX;
  Own<kj::Directory> OVar2;
  AutoCloseFd local_4c [2];
  Fault local_38;
  Fault f;
  SyscallResult local_20;
  undefined1 local_1c [4];
  SyscallResult _kjSyscallResult;
  int fd;
  TempDir *this_local;
  
  f.exception = (Exception *)local_1c;
  local_20 = _::Debug::syscall<kj::(anonymous_namespace)::TempDir::get()::_lambda()_1_>
                       ((anon_class_16_2_51560a79 *)&f,false);
  pvVar1 = _::Debug::SyscallResult::operator_cast_to_void_(&local_20);
  if (pvVar1 != (void *)0x0) {
    AutoCloseFd::AutoCloseFd(local_4c,(int)local_1c);
    newDiskDirectory((kj *)this,local_4c);
    AutoCloseFd::~AutoCloseFd(local_4c);
    OVar2.ptr = extraout_RDX;
    OVar2.disposer = (Disposer *)this;
    return OVar2;
  }
  osErrorNumber = _::Debug::SyscallResult::getErrorNumber(&local_20);
  _::Debug::Fault::Fault
            (&local_38,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-disk-test.c++"
             ,0xe3,osErrorNumber,"fd = open(filename.cStr(), O_RDONLY)","");
  _::Debug::Fault::fatal(&local_38);
}

Assistant:

Own<Directory> get() {
    int fd;
    KJ_SYSCALL(fd = open(filename.cStr(), O_RDONLY));
    return newDiskDirectory(AutoCloseFd(fd));
  }